

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O0

TridiagonalMatrix * construct_matrix(TridiagonalMatrix *__return_storage_ptr__,int nx,int nt)

{
  allocator<double> *this;
  size_type sVar1;
  reference pvVar2;
  double dVar3;
  double dVar4;
  int local_cc;
  int i;
  double b_and_c;
  double a;
  double tau;
  double h;
  value_type_conflict local_a0;
  undefined1 local_98 [8];
  vec cs;
  value_type_conflict local_78;
  undefined1 local_70 [8];
  vec bs;
  allocator<double> local_41;
  value_type_conflict local_40;
  undefined1 local_38 [8];
  vec as;
  int size;
  int nt_local;
  int nx_local;
  
  as.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = compute_linear_system_size(nx + -1);
  sVar1 = (size_type)
          as.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  local_40 = 1.0;
  std::allocator<double>::allocator(&local_41);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,sVar1,&local_40,&local_41);
  std::allocator<double>::~allocator(&local_41);
  sVar1 = (size_type)
          as.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  local_78 = 0.0;
  this = (allocator<double> *)
         ((long)&cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_70,sVar1,&local_78,this);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  sVar1 = (size_type)
          as.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  local_a0 = 0.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&h + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_98,sVar1,&local_a0,
             (allocator<double> *)((long)&h + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&h + 7));
  dVar3 = 0.7853981633974483 / (double)nx;
  dVar4 = -1.0 / (1.0 / (double)nt) - 2.0 / (dVar3 * dVar3);
  dVar3 = 1.0 / (dVar3 * dVar3);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_38,0);
  *pvVar2 = dVar4;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_98,0);
  *pvVar2 = dVar3;
  for (local_cc = 1; local_cc < nx + -2; local_cc = local_cc + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,(long)local_cc);
    *pvVar2 = dVar4;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_70,(long)local_cc);
    *pvVar2 = dVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_98,(long)local_cc);
    *pvVar2 = dVar3;
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_38,(long)(nx + -2));
  *pvVar2 = dVar4;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_70,(long)(nx + -2));
  *pvVar2 = dVar3;
  TridiagonalMatrix::TridiagonalMatrix
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_38,
             (vector<double,_std::allocator<double>_> *)local_70,(vec *)local_98);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_98);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_70);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

TridiagonalMatrix construct_matrix(int nx, int nt)
{
    int size = compute_linear_system_size(nx - 1);

    vec as(size, 1.0);
    vec bs(size, 0.0);
    vec cs(size, 0.0);

    double h = X / nx;
    double tau = T / nt;

    double a = - 1.0 / tau - 2.0 / (h * h);
    double b_and_c = 1.0 / (h * h);

    as[0] = a;
    cs[0] = b_and_c;
    for (int i = 1; i < nx - 2; i++)
    {
        as[i] = a;
        bs[i] = b_and_c;
        cs[i] = b_and_c;
    }
    as[nx - 2] = a;
    bs[nx - 2] = b_and_c;

    return TridiagonalMatrix(as, bs, cs);
}